

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m256v.h
# Opt level: O2

void m256v_set_el(m256v *M,int r,int c,uint8_t val)

{
  M->e[(long)c + (long)r * M->rstride] = val;
  return;
}

Assistant:

inline size_t m256v_get_el_offs(const m256v* M, int r, int c)
{
	assert(0 <= r);
	assert(0 <= c);
	assert(r < M->n_row);
	/* The check for the column is loose so as to make it possible
	 * to get a pointer to one beyond the last column
	 */
	assert(c <= M->n_col);

	return r * M->rstride + c;
}